

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder.c
# Opt level: O0

int av1_convert_sect5obus_to_annexb(uint8_t *buffer,size_t buffer_size,size_t *frame_size)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  long lVar4;
  uint64_t value;
  uint8_t *coded_value;
  long *in_RDX;
  long in_RSI;
  byte *in_RDI;
  size_t coded_obu_size;
  uint64_t obu_size;
  size_t obu_bytes_read;
  uint32_t obu_header_size;
  size_t length_of_obu_size;
  size_t length_of_payload_size;
  uint64_t obu_payload_size;
  uint8_t saved_obu_header [2];
  uint8_t *buff_ptr;
  size_t remaining_size;
  size_t output_size;
  uint8_t *local_78;
  undefined4 in_stack_ffffffffffffffa0;
  size_t in_stack_ffffffffffffffb0;
  uint64_t in_stack_ffffffffffffffb8;
  byte local_3a [2];
  byte *local_38;
  long local_30;
  uint8_t *local_28;
  long *local_20;
  long local_18;
  
  local_28 = (uint8_t *)0x0;
  local_30 = *in_RDX;
  local_38 = in_RDI;
  local_20 = in_RDX;
  local_18 = in_RSI;
  while( true ) {
    if (local_30 == 0) {
      *local_20 = (long)local_28;
      return 0;
    }
    uVar1 = 1;
    if (((int)(uint)*local_38 >> 2 & 1U) != 0) {
      uVar1 = 2;
    }
    uVar3 = (ulong)uVar1;
    memcpy(local_3a,local_38,(ulong)uVar1);
    local_3a[0] = local_3a[0] & 0xfd;
    iVar2 = aom_uleb_decode(local_38 + uVar1,local_30 - (ulong)uVar1,
                            (uint64_t *)&stack0xffffffffffffffb8,(size_t *)&stack0xffffffffffffffb0)
    ;
    if (iVar2 != 0) {
      return 1;
    }
    lVar4 = in_stack_ffffffffffffffb0 + uVar3;
    value = uVar1 + in_stack_ffffffffffffffb8;
    coded_value = (uint8_t *)aom_uleb_size_in_bytes(value);
    if ((uint8_t *)((local_18 - (long)local_28) - (local_30 - lVar4)) < coded_value + uVar1) {
      return 1;
    }
    memmove(local_38 + (long)coded_value + uVar1,local_38 + lVar4,local_30 - lVar4);
    lVar4 = in_stack_ffffffffffffffb8 + lVar4;
    iVar2 = aom_uleb_encode(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,coded_value,
                            (size_t *)CONCAT44(uVar1,in_stack_ffffffffffffffa0));
    if ((iVar2 != 0) || (local_78 != coded_value)) break;
    memcpy(local_38 + (long)coded_value,local_3a,(ulong)uVar1);
    local_30 = local_30 - lVar4;
    local_38 = coded_value + value + (long)local_38;
    local_28 = coded_value + value + (long)local_28;
  }
  return 1;
}

Assistant:

int av1_convert_sect5obus_to_annexb(uint8_t *buffer, size_t buffer_size,
                                    size_t *frame_size) {
  assert(*frame_size <= buffer_size);
  size_t output_size = 0;
  size_t remaining_size = *frame_size;
  uint8_t *buff_ptr = buffer;

  // go through each OBUs
  while (remaining_size > 0) {
    uint8_t saved_obu_header[2];
    uint64_t obu_payload_size;
    size_t length_of_payload_size;
    size_t length_of_obu_size;
    const uint32_t obu_header_size = (buff_ptr[0] >> 2) & 0x1 ? 2 : 1;
    size_t obu_bytes_read = obu_header_size;  // bytes read for current obu

    // save the obu header (1 or 2 bytes)
    memcpy(saved_obu_header, buff_ptr, obu_header_size);
    // clear the obu_has_size_field
    saved_obu_header[0] &= ~0x2;

    // get the payload_size and length of payload_size
    if (aom_uleb_decode(buff_ptr + obu_header_size,
                        remaining_size - obu_header_size, &obu_payload_size,
                        &length_of_payload_size) != 0) {
      return AOM_CODEC_ERROR;
    }
    obu_bytes_read += length_of_payload_size;

    // calculate the length of size of the obu header plus payload
    const uint64_t obu_size = obu_header_size + obu_payload_size;
    length_of_obu_size = aom_uleb_size_in_bytes(obu_size);

    if (length_of_obu_size + obu_header_size >
        buffer_size - output_size - (remaining_size - obu_bytes_read)) {
      return AOM_CODEC_ERROR;
    }
    // move the rest of data to new location
    memmove(buff_ptr + length_of_obu_size + obu_header_size,
            buff_ptr + obu_bytes_read, remaining_size - obu_bytes_read);
    obu_bytes_read += (size_t)obu_payload_size;

    // write the new obu size
    size_t coded_obu_size;
    if (aom_uleb_encode(obu_size, length_of_obu_size, buff_ptr,
                        &coded_obu_size) != 0 ||
        coded_obu_size != length_of_obu_size) {
      return AOM_CODEC_ERROR;
    }

    // write the saved (modified) obu_header following obu size
    memcpy(buff_ptr + length_of_obu_size, saved_obu_header, obu_header_size);

    remaining_size -= obu_bytes_read;
    buff_ptr += length_of_obu_size + (size_t)obu_size;
    output_size += length_of_obu_size + (size_t)obu_size;
  }

  *frame_size = output_size;
  return AOM_CODEC_OK;
}